

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O0

Vec_Int_t * Gia_ShowMapAdds(Gia_Man_t *p,Vec_Int_t *vAdds,int fFadds,Vec_Int_t *vBold)

{
  int iVar1;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  int local_3c;
  int Entry;
  int i;
  Vec_Int_t *vMapAdds;
  Vec_Bit_t *vIsBold;
  Vec_Int_t *vBold_local;
  int fFadds_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStartFull(iVar1);
  if (vBold != (Vec_Int_t *)0x0) {
    for (local_3c = 0; iVar1 = Vec_IntSize(vBold), local_3c < iVar1; local_3c = local_3c + 1) {
      iVar1 = Vec_IntEntry(vBold,local_3c);
      Vec_BitWriteEntry(p_00,iVar1,1);
    }
  }
  for (local_3c = 0; iVar1 = Vec_IntSize(vAdds), local_3c * 6 < iVar1; local_3c = local_3c + 1) {
    if ((fFadds == 0) || (iVar1 = Vec_IntEntry(vAdds,local_3c * 6 + 2), iVar1 != 0)) {
      iVar1 = Vec_IntEntry(vAdds,local_3c * 6 + 3);
      iVar1 = Vec_BitEntry(p_00,iVar1);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(vAdds,local_3c * 6 + 4);
        iVar1 = Vec_BitEntry(p_00,iVar1);
        if (iVar1 == 0) {
          iVar1 = Vec_IntEntry(vAdds,local_3c * 6 + 3);
          Vec_IntWriteEntry(p_01,iVar1,local_3c);
          iVar1 = Vec_IntEntry(vAdds,local_3c * 6 + 4);
          Vec_IntWriteEntry(p_01,iVar1,local_3c);
        }
      }
    }
  }
  Vec_BitFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Gia_ShowMapAdds( Gia_Man_t * p, Vec_Int_t * vAdds, int fFadds, Vec_Int_t * vBold )
{
    Vec_Bit_t * vIsBold = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMapAdds = Vec_IntStartFull( Gia_ManObjNum(p) ); int i, Entry;
    if ( vBold )
        Vec_IntForEachEntry( vBold, Entry, i )
            Vec_BitWriteEntry( vIsBold, Entry, 1 );
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( fFadds && Vec_IntEntry(vAdds, 6*i+2) == 0 )
            continue;
        if ( Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+4)) )
            continue;
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+3), i );
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+4), i );
    }
    Vec_BitFree( vIsBold );
    return vMapAdds;
}